

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O1

void __thiscall quic::Bbr2Sender::OnExitQuiescence(Bbr2Sender *this,QuicTime now)

{
  Bbr2Mode BVar1;
  QuicTime quiescence_start_time;
  
  quiescence_start_time.time_ = (this->last_quiescence_start_).time_;
  if (quiescence_start_time.time_ != 0) {
    BVar1 = this->mode_;
    if (DRAIN < BVar1) {
      if (BVar1 == PROBE_BW) {
        if (now.time_ <= quiescence_start_time.time_) {
          quiescence_start_time.time_ = now.time_;
        }
        BVar1 = Bbr2ProbeBwMode::OnExitQuiescence(&this->probe_bw_,now,quiescence_start_time);
      }
      else {
        if (now.time_ <= quiescence_start_time.time_) {
          quiescence_start_time.time_ = now.time_;
        }
        BVar1 = Bbr2ProbeRttMode::OnExitQuiescence(&this->probe_rtt_,now,quiescence_start_time);
      }
    }
    if (BVar1 != this->mode_) {
      if (this->mode_ == STARTUP) {
        Bbr2StartupMode::Leave(&this->startup_,now,(Bbr2CongestionEvent *)0x0);
      }
      this->mode_ = BVar1;
      if (BVar1 == PROBE_BW) {
        Bbr2ProbeBwMode::Enter(&this->probe_bw_,now,(Bbr2CongestionEvent *)0x0);
      }
      else if (BVar1 != DRAIN) {
        if (BVar1 == STARTUP) {
          Bbr2StartupMode::Enter(&this->startup_,now,(Bbr2CongestionEvent *)0x0);
        }
        else {
          Bbr2ProbeRttMode::Enter(&this->probe_rtt_,now,(Bbr2CongestionEvent *)0x0);
        }
      }
    }
    (this->last_quiescence_start_).time_ = 0;
  }
  return;
}

Assistant:

void Bbr2Sender::OnExitQuiescence(QuicTime now) {
  if (last_quiescence_start_ != QuicTime::Zero()) {
    Bbr2Mode next_mode = BBR2_MODE_DISPATCH(
        OnExitQuiescence(now, std::min(now, last_quiescence_start_)));
    if (next_mode != mode_) {
      BBR2_MODE_DISPATCH(Leave(now, nullptr));
      mode_ = next_mode;
      BBR2_MODE_DISPATCH(Enter(now, nullptr));
    }
    last_quiescence_start_ = QuicTime::Zero();
  }
}